

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O3

void duckdb::AvgFun::GetFunctions(void)

{
  vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *this;
  AggregateFunctionSet *in_RDI;
  FunctionNullHandling null_handling;
  initializer_list<duckdb::LogicalType> __l;
  undefined1 local_df0 [32];
  LogicalType local_dd0 [24];
  LogicalType local_db8 [24];
  LogicalType local_da0 [24];
  LogicalType local_d88 [24];
  LogicalType local_d70 [24];
  LogicalType local_d58 [24];
  LogicalType local_d40 [24];
  undefined **local_d28 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c00;
  undefined **local_bf8 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ad0;
  undefined **local_ac8 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9a0;
  undefined **local_998 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_870;
  undefined **local_868 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_740;
  undefined **local_738 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_610;
  undefined **local_608 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4e0;
  undefined **local_4d8 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  undefined **local_3a8 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_280;
  undefined **local_278 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  undefined **local_148 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  duckdb::AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_d40,DECIMAL);
  __l._M_len = 1;
  __l._M_array = local_d40;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_df0,__l,
             (allocator_type *)(local_df0 + 0x1f));
  duckdb::LogicalType::LogicalType(local_d58,DECIMAL);
  null_handling = DEFAULT_NULL_HANDLING;
  AggregateFunction::AggregateFunction
            ((AggregateFunction *)local_148,(vector<duckdb::LogicalType,_true> *)local_df0,local_d58
             ,(aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,DEFAULT_NULL_HANDLING,
             (aggregate_simple_update_t)0x0,BindDecimalAvg,(aggregate_destructor_t)0x0,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  this = (vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
         (in_RDI + 0x20);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,(AggregateFunction *)local_148);
  local_148[0] = &PTR__AggregateFunction_00890e90;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_148);
  duckdb::LogicalType::~LogicalType(local_d58);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_df0);
  duckdb::LogicalType::~LogicalType(local_d40);
  GetAverageAggregate((AggregateFunction *)local_278,INT16);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,(AggregateFunction *)local_278);
  local_278[0] = &PTR__AggregateFunction_00890e90;
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_278);
  GetAverageAggregate((AggregateFunction *)local_3a8,INT32);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,(AggregateFunction *)local_3a8);
  local_3a8[0] = &PTR__AggregateFunction_00890e90;
  if (local_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_280._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3a8);
  GetAverageAggregate((AggregateFunction *)local_4d8,INT64);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,(AggregateFunction *)local_4d8);
  local_4d8[0] = &PTR__AggregateFunction_00890e90;
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_4d8);
  GetAverageAggregate((AggregateFunction *)local_608,INT128);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,(AggregateFunction *)local_608);
  local_608[0] = &PTR__AggregateFunction_00890e90;
  if (local_4e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4e0._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_608);
  GetAverageAggregate((AggregateFunction *)local_738,INTERVAL);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,(AggregateFunction *)local_738);
  local_738[0] = &PTR__AggregateFunction_00890e90;
  if (local_610._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_610._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_738);
  duckdb::LogicalType::LogicalType((LogicalType *)local_df0,DOUBLE);
  duckdb::LogicalType::LogicalType(local_d70,DOUBLE);
  AggregateFunction::
  UnaryAggregate<duckdb::AvgState<double>,double,double,duckdb::NumericAverageOperation,(duckdb::AggregateDestructorType)0>
            ((AggregateFunction *)local_868,(AggregateFunction *)local_df0,local_d70,
             (LogicalType *)0x0,null_handling);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,(AggregateFunction *)local_868);
  local_868[0] = &PTR__AggregateFunction_00890e90;
  if (local_740._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_740._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_868);
  duckdb::LogicalType::~LogicalType(local_d70);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_df0);
  duckdb::LogicalType::LogicalType((LogicalType *)local_df0,TIMESTAMP);
  duckdb::LogicalType::LogicalType(local_d88,TIMESTAMP);
  AggregateFunction::
  UnaryAggregate<duckdb::AvgState<duckdb::hugeint_t>,long,long,duckdb::DiscreteAverageOperation,(duckdb::AggregateDestructorType)0>
            ((AggregateFunction *)local_998,(AggregateFunction *)local_df0,local_d88,
             (LogicalType *)0x0,null_handling);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,(AggregateFunction *)local_998);
  local_998[0] = &PTR__AggregateFunction_00890e90;
  if (local_870._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_870._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_998);
  duckdb::LogicalType::~LogicalType(local_d88);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_df0);
  duckdb::LogicalType::LogicalType((LogicalType *)local_df0,TIMESTAMP_TZ);
  duckdb::LogicalType::LogicalType(local_da0,TIMESTAMP_TZ);
  AggregateFunction::
  UnaryAggregate<duckdb::AvgState<duckdb::hugeint_t>,long,long,duckdb::DiscreteAverageOperation,(duckdb::AggregateDestructorType)0>
            ((AggregateFunction *)local_ac8,(AggregateFunction *)local_df0,local_da0,
             (LogicalType *)0x0,null_handling);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,(AggregateFunction *)local_ac8);
  local_ac8[0] = &PTR__AggregateFunction_00890e90;
  if (local_9a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9a0._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_ac8);
  duckdb::LogicalType::~LogicalType(local_da0);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_df0);
  duckdb::LogicalType::LogicalType((LogicalType *)local_df0,TIME);
  duckdb::LogicalType::LogicalType(local_db8,TIME);
  AggregateFunction::
  UnaryAggregate<duckdb::AvgState<duckdb::hugeint_t>,long,long,duckdb::DiscreteAverageOperation,(duckdb::AggregateDestructorType)0>
            ((AggregateFunction *)local_bf8,(AggregateFunction *)local_df0,local_db8,
             (LogicalType *)0x0,null_handling);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,(AggregateFunction *)local_bf8);
  local_bf8[0] = &PTR__AggregateFunction_00890e90;
  if (local_ad0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ad0._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_bf8);
  duckdb::LogicalType::~LogicalType(local_db8);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_df0);
  duckdb::LogicalType::LogicalType((LogicalType *)local_df0,TIME_TZ);
  duckdb::LogicalType::LogicalType(local_dd0,TIME_TZ);
  AggregateFunction::
  UnaryAggregate<duckdb::AvgState<duckdb::hugeint_t>,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::TimeTZAverageOperation,(duckdb::AggregateDestructorType)0>
            ((AggregateFunction *)local_d28,(AggregateFunction *)local_df0,local_dd0,
             (LogicalType *)0x0,null_handling);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,(AggregateFunction *)local_d28);
  local_d28[0] = &PTR__AggregateFunction_00890e90;
  if (local_c00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c00._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_d28);
  duckdb::LogicalType::~LogicalType(local_dd0);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_df0);
  return;
}

Assistant:

AggregateFunctionSet AvgFun::GetFunctions() {
	AggregateFunctionSet avg;

	avg.AddFunction(AggregateFunction({LogicalTypeId::DECIMAL}, LogicalTypeId::DECIMAL, nullptr, nullptr, nullptr,
	                                  nullptr, nullptr, FunctionNullHandling::DEFAULT_NULL_HANDLING, nullptr,
	                                  BindDecimalAvg));
	avg.AddFunction(GetAverageAggregate(PhysicalType::INT16));
	avg.AddFunction(GetAverageAggregate(PhysicalType::INT32));
	avg.AddFunction(GetAverageAggregate(PhysicalType::INT64));
	avg.AddFunction(GetAverageAggregate(PhysicalType::INT128));
	avg.AddFunction(GetAverageAggregate(PhysicalType::INTERVAL));
	avg.AddFunction(AggregateFunction::UnaryAggregate<AvgState<double>, double, double, NumericAverageOperation>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE));

	avg.AddFunction(AggregateFunction::UnaryAggregate<AvgState<hugeint_t>, int64_t, int64_t, DiscreteAverageOperation>(
	    LogicalType::TIMESTAMP, LogicalType::TIMESTAMP));
	avg.AddFunction(AggregateFunction::UnaryAggregate<AvgState<hugeint_t>, int64_t, int64_t, DiscreteAverageOperation>(
	    LogicalType::TIMESTAMP_TZ, LogicalType::TIMESTAMP_TZ));
	avg.AddFunction(AggregateFunction::UnaryAggregate<AvgState<hugeint_t>, int64_t, int64_t, DiscreteAverageOperation>(
	    LogicalType::TIME, LogicalType::TIME));
	avg.AddFunction(
	    AggregateFunction::UnaryAggregate<AvgState<hugeint_t>, dtime_tz_t, dtime_tz_t, TimeTZAverageOperation>(
	        LogicalType::TIME_TZ, LogicalType::TIME_TZ));

	return avg;
}